

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
std::
_Tuple_impl<2ul,testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>>
::
_Tuple_impl<testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>,void>
          (_Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
           *this,Matcher<const_std::optional<SDL_Rect>_&> *__head,
          Matcher<const_std::optional<SDL_Rect>_&> *__tail)

{
  (this->super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>).
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.vtable_ =
       (__tail->super_MatcherBase<const_std::optional<SDL_Rect>_&>).vtable_;
  (this->super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>).
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.buffer_ =
       (__tail->super_MatcherBase<const_std::optional<SDL_Rect>_&>).buffer_;
  (__tail->super_MatcherBase<const_std::optional<SDL_Rect>_&>).vtable_ = (VTable *)0x0;
  (this->super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>).
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_002f60a0;
  (this->super__Head_base<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>).
  _M_head_impl.super_MatcherBase<const_std::optional<SDL_Rect>_&>.vtable_ =
       (__head->super_MatcherBase<const_std::optional<SDL_Rect>_&>).vtable_;
  (this->super__Head_base<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>).
  _M_head_impl.super_MatcherBase<const_std::optional<SDL_Rect>_&>.buffer_ =
       (__head->super_MatcherBase<const_std::optional<SDL_Rect>_&>).buffer_;
  (__head->super_MatcherBase<const_std::optional<SDL_Rect>_&>).vtable_ = (VTable *)0x0;
  (this->super__Head_base<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>).
  _M_head_impl.super_MatcherBase<const_std::optional<SDL_Rect>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_002f60a0;
  return;
}

Assistant:

MatcherBase(MatcherBase&& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    other.vtable_ = nullptr;
  }